

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall
CLI::IncorrectConstruction::IncorrectConstruction(IncorrectConstruction *this,string *msg)

{
  string local_70;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *msg_local;
  IncorrectConstruction *this_local;
  
  local_18 = msg;
  msg_local = (string *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"IncorrectConstruction",&local_39);
  ::std::__cxx11::string::string
            ((string *)&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)msg);
  IncorrectConstruction(this,&local_38,&local_70,IncorrectConstruction);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

static IncorrectConstruction PositionalFlag(std::string name) {
        return IncorrectConstruction(name + ": Flags cannot be positional");
    }